

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O3

UINT8 GYMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT8 UVar1;
  UINT32 UVar2;
  int *piVar3;
  byte *pbVar4;
  
  DataLoader_ReadUntil(dataLoader,4);
  UVar2 = DataLoader_GetSize(dataLoader);
  UVar1 = 0xf1;
  if (3 < UVar2) {
    piVar3 = (int *)DataLoader_GetData(dataLoader);
    if (*piVar3 == 0x584d5947) {
      UVar1 = '\0';
    }
    else {
      pbVar4 = DataLoader_GetData(dataLoader);
      UVar1 = (*pbVar4 < 4) * '\x10' + 0xf0;
    }
  }
  return UVar1;
}

Assistant:

UINT8 GYMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x04);
	if (DataLoader_GetSize(dataLoader) < 0x04)
		return 0xF1;	// file too small
	if (! memcmp(&DataLoader_GetData(dataLoader)[0x00], "GYMX", 4))
		return 0x00;	// valid GYMX header
	if (DataLoader_GetData(dataLoader)[0x00] <= 0x03)	// check for a valid command byte
		return 0x00;
	return 0xF0;	// invalid file
}